

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall
minihttp::HttpSocket::QueueRequest(HttpSocket *this,string *what,char *extraRequest,void *user)

{
  bool bVar1;
  Request req;
  Request local_f8;
  
  Request::Request(&local_f8,what,&(this->super_TcpSocket)._host,(this->super_TcpSocket)._lastport,
                   user);
  if (extraRequest != (char *)0x0) {
    strlen(extraRequest);
    std::__cxx11::string::_M_replace
              ((ulong)&local_f8.extraGetHeaders,0,(char *)local_f8.extraGetHeaders._M_string_length,
               (ulong)extraRequest);
  }
  bVar1 = SendRequest(this,&local_f8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.post.data._M_dataplus._M_p != &local_f8.post.data.field_2) {
    operator_delete(local_f8.post.data._M_dataplus._M_p,
                    local_f8.post.data.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.extraGetHeaders._M_dataplus._M_p != &local_f8.extraGetHeaders.field_2) {
    operator_delete(local_f8.extraGetHeaders._M_dataplus._M_p,
                    local_f8.extraGetHeaders.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.resource._M_dataplus._M_p != &local_f8.resource.field_2) {
    operator_delete(local_f8.resource._M_dataplus._M_p,
                    local_f8.resource.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.header._M_dataplus._M_p != &local_f8.header.field_2) {
    operator_delete(local_f8.header._M_dataplus._M_p,
                    local_f8.header.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.host._M_dataplus._M_p != &local_f8.host.field_2) {
    operator_delete(local_f8.host._M_dataplus._M_p,local_f8.host.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.protocol._M_dataplus._M_p != &local_f8.protocol.field_2) {
    operator_delete(local_f8.protocol._M_dataplus._M_p,
                    local_f8.protocol.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool HttpSocket::QueueRequest(const std::string& what, const char *extraRequest /*= NULL*/, void *user /* = NULL */)
{
    Request req(what, _host, _lastport, user);
    if(extraRequest)
        req.extraGetHeaders = extraRequest;
    return SendRequest(req, true);
}